

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

int dosearch0(int aflag)

{
  boolean bVar1;
  byte bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  trap *trap_00;
  monst *pmVar6;
  monst *local_38;
  int local_30;
  int local_2c;
  int fund;
  monst *mtmp;
  trap *trap;
  xchar y;
  xchar x;
  int aflag_local;
  
  if ((u._1052_1_ & 1) == 0) {
    if (((uwep == (obj *)0x0) || (uwep->oartifact == '\0')) ||
       (bVar1 = spec_ability(uwep,0x200), bVar1 == '\0')) {
      local_30 = 0;
    }
    else {
      local_30 = (int)uwep->spe;
    }
    local_2c = local_30;
    if (((ublindf != (obj *)0x0) && (ublindf->otyp == 0xed)) &&
       ((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
      local_2c = local_30 + 2;
    }
    if (5 < local_2c) {
      local_2c = 5;
    }
    for (trap._7_1_ = u.ux + -1; (int)trap._7_1_ < u.ux + 2; trap._7_1_ = trap._7_1_ + '\x01') {
      for (trap._6_1_ = u.uy + -1; (int)trap._6_1_ < u.uy + 2; trap._6_1_ = trap._6_1_ + '\x01') {
        if ((((('\0' < trap._7_1_) && (trap._7_1_ < 'P')) && (-1 < trap._6_1_)) &&
            (trap._6_1_ < '\x15')) && ((trap._7_1_ != u.ux || (trap._6_1_ != u.uy)))) {
          if ((((u.uprops[0x1e].intrinsic != 0) ||
               ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
             (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) && (aflag == 0)))) {
            feel_location(trap._7_1_,trap._6_1_);
          }
          if (level->locations[trap._7_1_][trap._6_1_].typ == '\x0f') {
            iVar3 = rnl(7 - local_2c);
            if (iVar3 == 0) {
              cvt_sdoor_to_door(level->locations[trap._7_1_] + trap._6_1_,&u.uz);
              exercise(2,'\x01');
              nomul(0,(char *)0x0);
              if ((((u.uprops[0x1e].intrinsic == 0) &&
                   ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                 (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) || (aflag != 0)))) {
                newsym((int)trap._7_1_,(int)trap._6_1_);
              }
              else {
                feel_location(trap._7_1_,trap._6_1_);
              }
              if (flags.verbose != '\0') {
                pline("You find a secret door.");
              }
            }
          }
          else if (level->locations[trap._7_1_][trap._6_1_].typ == '\x10') {
            iVar3 = rnl(7 - local_2c);
            if (iVar3 == 0) {
              level->locations[trap._7_1_][trap._6_1_].typ = '\x18';
              unblock_point((int)trap._7_1_,(int)trap._6_1_);
              exercise(2,'\x01');
              nomul(0,(char *)0x0);
              newsym((int)trap._7_1_,(int)trap._6_1_);
              if (flags.verbose != '\0') {
                pline("You find a secret passage.");
              }
            }
          }
          else {
            if ((level->monsters[trap._7_1_][trap._6_1_] == (monst *)0x0) ||
               ((*(uint *)&level->monsters[trap._7_1_][trap._6_1_]->field_0x60 >> 9 & 1) != 0)) {
              local_38 = (monst *)0x0;
            }
            else {
              local_38 = level->monsters[trap._7_1_][trap._6_1_];
            }
            if ((local_38 == (monst *)0x0) || (aflag != 0)) {
LAB_001803fb:
              if (((aflag == 0) && (local_38 == (monst *)0x0)) &&
                 ((((u.uprops[0x1e].intrinsic == 0 &&
                    (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                     (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                   ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                  ((*(uint *)&level->locations[trap._7_1_][trap._6_1_].field_0x6 >> 3 & 1) != 0))))
              {
                unmap_object((int)trap._7_1_,(int)trap._6_1_);
                newsym((int)trap._7_1_,(int)trap._6_1_);
              }
              trap_00 = t_at(level,(int)trap._7_1_,(int)trap._6_1_);
              if (((trap_00 != (trap *)0x0) && (((byte)trap_00->field_0x8 >> 5 & 1) == 0)) &&
                 (iVar3 = rnl(8), iVar3 == 0)) {
                nomul(0,(char *)0x0);
                if ((trap_00->field_0x8 & 0x1f) == 0x14) {
                  pmVar6 = activate_statue_trap(trap_00,trap._7_1_,trap._6_1_,'\0');
                  if (pmVar6 != (monst *)0x0) {
                    exercise(2,'\x01');
                    return 1;
                  }
                  return 1;
                }
                find_trap(trap_00);
              }
            }
            else {
              if (local_38->m_ap_type == '\0') {
                if (local_38->wormno == '\0') {
                  if ((viz_array[local_38->my][local_38->mx] & 2U) != 0) goto LAB_00180142;
                  if ((((u.uprops[0x1e].intrinsic == 0) &&
                       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                        (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                      ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                     (((u.uprops[0x40].intrinsic != 0 ||
                       ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0))
                       )) && ((local_38->data->mflags3 & 0x200) != 0)))) {
                    bVar2 = viz_array[local_38->my][local_38->mx] & 1;
                    goto joined_r0x0018013c;
                  }
                }
                else {
                  bVar2 = worm_known(level,local_38);
joined_r0x0018013c:
                  if (bVar2 != 0) {
LAB_00180142:
                    if ((((((*(uint *)&local_38->field_0x60 >> 1 & 1) == 0) ||
                          (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) ||
                        (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
                       ((((*(uint *)&local_38->field_0x60 >> 7 & 1) == 0 &&
                         ((*(uint *)&local_38->field_0x60 >> 9 & 1) == 0)) &&
                        (((byte)u._1052_1_ >> 5 & 1) == 0)))) goto LAB_001803fb;
                  }
                }
                if (((((local_38->data->mflags1 & 0x10000) == 0) &&
                     ((poVar4 = which_armor(local_38,4), poVar4 == (obj *)0x0 ||
                      (poVar4 = which_armor(local_38,4), poVar4->otyp != 0x4f)))) &&
                    ((((u.uprops[0x1e].intrinsic != 0 ||
                       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                        (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                      (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
                       (((((u.uprops[0x19].intrinsic != 0 ||
                           ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
                          (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)) &&
                        (u.uprops[0x19].blocked == 0)))))) ||
                     (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
                      (iVar3 = dist2((int)local_38->mx,(int)local_38->my,(int)u.ux,(int)u.uy),
                      iVar3 < 0x41)))))) ||
                   (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
                    (bVar1 = match_warn_of_mon(local_38), bVar1 != '\0')))) goto LAB_001803fb;
                if (((*(uint *)&local_38->field_0x60 >> 7 & 1) != 0) &&
                   (((local_38->data->mflags1 & 0x100) != 0 || (local_38->data->mlet == '9')))) {
                  *(uint *)&local_38->field_0x60 = *(uint *)&local_38->field_0x60 & 0xffffff7f;
                }
                newsym((int)trap._7_1_,(int)trap._6_1_);
              }
              else {
                seemimic(local_38);
              }
              exercise(2,'\x01');
              if (local_38->wormno == '\0') {
                if ((viz_array[local_38->my][local_38->mx] & 2U) != 0) goto LAB_0017fb49;
                if (((((u.uprops[0x1e].intrinsic == 0) &&
                      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                    ((u.uprops[0x40].intrinsic != 0 ||
                     ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0))))
                    )) && ((local_38->data->mflags3 & 0x200) != 0)) {
                  bVar2 = viz_array[local_38->my][local_38->mx] & 1;
                  goto joined_r0x0017fb43;
                }
              }
              else {
                bVar2 = worm_known(level,local_38);
joined_r0x0017fb43:
                if (bVar2 != 0) {
LAB_0017fb49:
                  if ((((((*(uint *)&local_38->field_0x60 >> 1 & 1) == 0) ||
                        (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) ||
                      (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
                     ((((*(uint *)&local_38->field_0x60 >> 7 & 1) == 0 &&
                       ((*(uint *)&local_38->field_0x60 >> 9 & 1) == 0)) &&
                      (((byte)u._1052_1_ >> 5 & 1) == 0)))) goto LAB_0017fdfb;
                }
              }
              if (((((local_38->data->mflags1 & 0x10000) == 0) &&
                   ((poVar4 = which_armor(local_38,4), poVar4 == (obj *)0x0 ||
                    (poVar4 = which_armor(local_38,4), poVar4->otyp != 0x4f)))) &&
                  ((((((u.uprops[0x1e].intrinsic != 0 ||
                       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                        (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                      ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) &&
                     ((((u.uprops[0x19].intrinsic != 0 ||
                        ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
                       (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))) &&
                    (u.uprops[0x19].blocked == 0)) ||
                   (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
                    (iVar3 = dist2((int)local_38->mx,(int)local_38->my,(int)u.ux,(int)u.uy),
                    iVar3 < 0x41)))))) ||
                 (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
                  (bVar1 = match_warn_of_mon(local_38), bVar1 != '\0')))) {
LAB_0017fdfb:
                if (((local_38->data->mflags1 & 0x10000) == 0) &&
                   ((poVar4 = which_armor(local_38,4), poVar4 == (obj *)0x0 ||
                    (poVar4 = which_armor(local_38,4), poVar4->otyp != 0x4f)))) {
                  if ((((u.uprops[0x1e].intrinsic != 0) ||
                       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                        (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                      (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
                       ((((u.uprops[0x19].intrinsic != 0 ||
                          ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
                         (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))))) &&
                     (u.uprops[0x19].blocked == 0)) {
                    return 1;
                  }
                  if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
                     (iVar3 = dist2((int)local_38->mx,(int)local_38->my,(int)u.ux,(int)u.uy),
                     iVar3 < 0x41)) {
                    return 1;
                  }
                }
                if (u.uprops[0x42].intrinsic != 0) {
                  return 1;
                }
                if (u.uprops[0x42].extrinsic == 0) {
                  bVar1 = match_warn_of_mon(local_38);
                  if (bVar1 == '\0') {
                    pcVar5 = a_monnam(local_38);
                    pline("You find %s.",pcVar5);
                    return 1;
                  }
                  return 1;
                }
                return 1;
              }
              if ((*(uint *)&level->locations[trap._7_1_][trap._6_1_].field_0x6 >> 3 & 1) == 0) {
                pline("You feel an unseen monster!");
                map_invisible(trap._7_1_,trap._6_1_);
                return 1;
              }
            }
          }
        }
      }
    }
  }
  else if (aflag == 0) {
    pline("What are you looking for?  The exit?");
  }
  return 1;
}

Assistant:

int dosearch0(int aflag)
{
	xchar x, y;
	struct trap *trap;
	struct monst *mtmp;

	if (u.uswallow) {
		if (!aflag)
			pline("What are you looking for?  The exit?");
	} else {
	    int fund = (uwep && uwep->oartifact &&
		    spec_ability(uwep, SPFX_SEARCH)) ?
		    uwep->spe : 0;
	    if (ublindf && ublindf->otyp == LENSES && !Blind)
		    fund += 2; /* JDS: lenses help searching */
	    if (fund > 5) fund = 5;
	    for (x = u.ux-1; x < u.ux+2; x++)
	      for (y = u.uy-1; y < u.uy+2; y++) {
		if (!isok(x,y)) continue;
		if (x != u.ux || y != u.uy) {
		    if (Blind && !aflag) feel_location(x,y);
		    if (level->locations[x][y].typ == SDOOR) {
			if (rnl(7-fund)) continue;
			cvt_sdoor_to_door(&level->locations[x][y], &u.uz); /* .typ = DOOR */
			exercise(A_WIS, TRUE);
			nomul(0, NULL);
			if (Blind && !aflag)
			    feel_location(x,y);	/* make sure it shows up */
			else
			    newsym(x,y);
			if (flags.verbose) pline("You find a secret door.");
		    } else if (level->locations[x][y].typ == SCORR) {
			if (rnl(7-fund)) continue;
			level->locations[x][y].typ = CORR;
			unblock_point(x,y);	/* vision */
			exercise(A_WIS, TRUE);
			nomul(0, NULL);
			newsym(x,y);
			if (flags.verbose) pline("You find a secret passage.");
		    } else {
		/* Be careful not to find anything in an SCORR or SDOOR */
			if ((mtmp = m_at(level, x, y)) && !aflag) {
			    if (mtmp->m_ap_type) {
				seemimic(mtmp);
		find:		exercise(A_WIS, TRUE);
				if (!canspotmon(level, mtmp)) {
				    if (level->locations[x][y].mem_invis) {
					/* found invisible monster in a square
					 * which already has an 'I' in it.
					 * Logically, this should still take
					 * time and lead to a return(1), but if
					 * we did that the player would keep
					 * finding the same monster every turn.
					 */
					continue;
				    } else {
					pline("You feel an unseen monster!");
					map_invisible(x, y);
				    }
				} else if (!sensemon(mtmp))
				    pline("You find %s.", a_monnam(mtmp));
				return 1;
			    }
			    if (!canspotmon(level, mtmp)) {
				if (mtmp->mundetected &&
				   (is_hider(mtmp->data) || mtmp->data->mlet == S_EEL))
					mtmp->mundetected = 0;
				newsym(x,y);
				goto find;
			    }
			}

			/* see if an invisible monster has moved--if Blind,
			 * feel_location() already did it
			 */
			if (!aflag && !mtmp && !Blind &&
				    level->locations[x][y].mem_invis) {
			    unmap_object(x,y);
			    newsym(x,y);
			}

			if ((trap = t_at(level, x,y)) && !trap->tseen && !rnl(8)) {
			    nomul(0, NULL);

			    if (trap->ttyp == STATUE_TRAP) {
				if (activate_statue_trap(trap, x, y, FALSE))
				    exercise(A_WIS, TRUE);
				return 1;
			    } else {
				find_trap(trap);
			    }
			}
		    }
		}
	    }
	}
	return 1;
}